

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O2

__m256i * compute_directions_avx2(__m256i *lines,int32_t *cost_frist_8x8,int32_t *cost_second_8x8)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i *in_RAX;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  
  alVar1 = *lines;
  alVar2 = lines[1];
  alVar3 = lines[2];
  alVar4 = lines[3];
  auVar6 = vpslldq_avx2((undefined1  [32])alVar1,0xe);
  auVar7 = vpsrldq_avx2((undefined1  [32])alVar1,2);
  auVar9 = vpslldq_avx2((undefined1  [32])alVar2,0xc);
  auVar6 = vpaddw_avx2(auVar9,auVar6);
  auVar9 = vpsrldq_avx2((undefined1  [32])alVar2,4);
  auVar7 = vpaddw_avx2(auVar9,auVar7);
  auVar9 = vpaddw_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar1);
  auVar5 = vpslldq_avx2((undefined1  [32])alVar3,10);
  auVar10 = vpsrldq_avx2((undefined1  [32])alVar3,6);
  auVar11 = vpslldq_avx2((undefined1  [32])alVar4,8);
  auVar5 = vpaddw_avx2(auVar5,auVar11);
  auVar6 = vpaddw_avx2(auVar6,auVar5);
  auVar5 = vpsrldq_avx2((undefined1  [32])alVar4,8);
  auVar5 = vpaddw_avx2(auVar10,auVar5);
  auVar7 = vpaddw_avx2(auVar7,auVar5);
  auVar5 = vpaddw_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar3);
  auVar10 = vpslldq_avx2(auVar9,10);
  auVar11 = vpslldq_avx2(auVar5,8);
  auVar10 = vpaddw_avx2(auVar11,auVar10);
  auVar11 = vpslldq_avx2(auVar9,4);
  auVar8 = vpslldq_avx2(auVar5,6);
  auVar11 = vpaddw_avx2(auVar8,auVar11);
  auVar8 = vpaddw_avx2(auVar5,auVar9);
  alVar1 = lines[4];
  auVar12 = vpslldq_avx2((undefined1  [32])alVar1,6);
  auVar13 = vpsrldq_avx2((undefined1  [32])alVar1,10);
  alVar2 = lines[5];
  auVar15 = vpslldq_avx2((undefined1  [32])alVar2,4);
  auVar12 = vpaddw_avx2(auVar12,auVar15);
  auVar15 = vpsrldq_avx2((undefined1  [32])alVar2,0xc);
  auVar13 = vpaddw_avx2(auVar13,auVar15);
  auVar15 = vpaddw_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar1);
  auVar14 = vpslldq_avx2(auVar15,6);
  auVar16 = vpslldq_avx2(auVar15,8);
  alVar1 = lines[6];
  auVar17 = vpslldq_avx2((undefined1  [32])alVar1,2);
  auVar19 = vpsrldq_avx2((undefined1  [32])alVar1,0xe);
  auVar13 = vpaddw_avx2(auVar13,auVar19);
  auVar7 = vpaddw_avx2(auVar13,auVar7);
  auVar12 = vpaddw_avx2(auVar12,(undefined1  [32])lines[7]);
  auVar6 = vpaddw_avx2(auVar12,auVar6);
  auVar6 = vpaddw_avx2(auVar17,auVar6);
  auVar12 = vpaddw_avx2((undefined1  [32])lines[7],(undefined1  [32])alVar1);
  auVar13 = vpslldq_avx2(auVar12,4);
  auVar13 = vpaddw_avx2(auVar14,auVar13);
  auVar10 = vpaddw_avx2(auVar13,auVar10);
  auVar13 = vpslldq_avx2(auVar12,10);
  auVar13 = vpaddw_avx2(auVar16,auVar13);
  auVar11 = vpaddw_avx2(auVar13,auVar11);
  auVar13 = vpaddw_avx2(auVar15,auVar12);
  auVar7 = vpshufb_avx2(auVar7,_DAT_004c1fe0);
  auVar14 = vpunpcklwd_avx2(auVar6,auVar7);
  auVar7 = vpunpckhwd_avx2(auVar6,auVar7);
  auVar6 = vpmaddwd_avx2(auVar14,auVar14);
  auVar7 = vpmaddwd_avx2(auVar7,auVar7);
  auVar14 = vpmulld_avx2(auVar6,_DAT_004c2000);
  auVar7 = vpmulld_avx2(auVar7,_DAT_004c2020);
  auVar6 = vpaddw_avx2(auVar13,auVar8);
  auVar13 = vpaddd_avx2(auVar7,auVar14);
  auVar16._16_16_ = _DAT_004c1fa0;
  auVar16._0_16_ = _DAT_004c1fa0;
  auVar7 = vpshufb_avx2(auVar9,auVar16);
  auVar17._16_16_ = _DAT_004c1fb0;
  auVar17._0_16_ = _DAT_004c1fb0;
  auVar8 = vpshufb_avx2(auVar5,auVar17);
  auVar7 = vpaddw_avx2(auVar8,auVar7);
  auVar19._16_16_ = _DAT_004c06f0;
  auVar19._0_16_ = _DAT_004c06f0;
  auVar8 = vpshufb_avx2(auVar15,auVar19);
  auVar18._16_16_ = _DAT_004c0700;
  auVar18._0_16_ = _DAT_004c0700;
  auVar14 = vpshufb_avx2(auVar12,auVar18);
  auVar8 = vpaddw_avx2(auVar8,auVar14);
  auVar7 = vpaddw_avx2(auVar7,auVar8);
  auVar8 = vpunpcklwd_avx2(auVar11,auVar7);
  auVar11 = vpunpckhwd_avx2(auVar11,auVar7);
  auVar7 = vpmaddwd_avx2(auVar8,auVar8);
  auVar11 = vpmaddwd_avx2(auVar11,auVar11);
  auVar8._16_16_ = _DAT_004c0710;
  auVar8._0_16_ = _DAT_004c0710;
  auVar7 = vpmulld_avx2(auVar7,auVar8);
  auVar14._16_16_ = _DAT_004c0720;
  auVar14._0_16_ = _DAT_004c0720;
  auVar11 = vpmulld_avx2(auVar11,auVar14);
  auVar11 = vpaddd_avx2(auVar7,auVar11);
  auVar7 = vpshufb_avx2(auVar9,auVar18);
  auVar9 = vpshufb_avx2(auVar5,auVar19);
  auVar7 = vpaddw_avx2(auVar9,auVar7);
  auVar9 = vpshufb_avx2(auVar15,auVar17);
  auVar5 = vpshufb_avx2(auVar12,auVar16);
  auVar9 = vpaddw_avx2(auVar9,auVar5);
  auVar7 = vpaddw_avx2(auVar7,auVar9);
  auVar5 = vpunpcklwd_avx2(auVar10,auVar7);
  auVar9 = vpunpckhwd_avx2(auVar10,auVar7);
  auVar7 = vpmaddwd_avx2(auVar5,auVar5);
  auVar9 = vpmaddwd_avx2(auVar9,auVar9);
  auVar7 = vpmulld_avx2(auVar7,auVar8);
  auVar9 = vpmulld_avx2(auVar9,auVar14);
  auVar7 = vpaddd_avx2(auVar9,auVar7);
  auVar9._8_4_ = 0x69;
  auVar9._0_8_ = 0x6900000069;
  auVar9._12_4_ = 0x69;
  auVar9._16_4_ = 0x69;
  auVar9._20_4_ = 0x69;
  auVar9._24_4_ = 0x69;
  auVar9._28_4_ = 0x69;
  auVar6 = vpmaddwd_avx2(auVar6,auVar6);
  auVar6 = vpmulld_avx2(auVar6,auVar9);
  auVar5 = vpunpckldq_avx2(auVar13,auVar7);
  auVar10 = vpunpckldq_avx2(auVar6,auVar11);
  auVar7 = vpunpckhdq_avx2(auVar13,auVar7);
  auVar9 = vpunpckhdq_avx2(auVar6,auVar11);
  auVar11 = vpunpcklqdq_avx2(auVar5,auVar10);
  auVar6 = vpunpckhqdq_avx2(auVar5,auVar10);
  auVar5 = vpunpcklqdq_avx2(auVar7,auVar9);
  auVar6 = vpaddd_avx2(auVar6,auVar5);
  auVar7 = vpunpckhqdq_avx2(auVar7,auVar9);
  auVar7 = vpaddd_avx2(auVar11,auVar7);
  auVar6 = vpaddd_avx2(auVar7,auVar6);
  *(undefined1 (*) [16])cost_frist_8x8 = auVar6._0_16_;
  *(undefined1 (*) [16])cost_second_8x8 = auVar6._16_16_;
  return in_RAX;
}

Assistant:

static inline __m256i compute_directions_avx2(__m256i *lines,
                                              int32_t cost_frist_8x8[4],
                                              int32_t cost_second_8x8[4]) {
  __m256i partial4a, partial4b, partial5a, partial5b, partial7a, partial7b;
  __m256i partial6;
  __m256i tmp;
  /* Partial sums for lines 0 and 1. */
  partial4a = _mm256_slli_si256(lines[0], 14);
  partial4b = _mm256_srli_si256(lines[0], 2);
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[1], 12));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[1], 4));
  tmp = _mm256_add_epi16(lines[0], lines[1]);
  partial5a = _mm256_slli_si256(tmp, 10);
  partial5b = _mm256_srli_si256(tmp, 6);
  partial7a = _mm256_slli_si256(tmp, 4);
  partial7b = _mm256_srli_si256(tmp, 12);
  partial6 = tmp;

  /* Partial sums for lines 2 and 3. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[2], 10));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[2], 6));
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[3], 8));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[3], 8));
  tmp = _mm256_add_epi16(lines[2], lines[3]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 8));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 8));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 6));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 10));
  partial6 = _mm256_add_epi16(partial6, tmp);

  /* Partial sums for lines 4 and 5. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[4], 6));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[4], 10));
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[5], 4));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[5], 12));
  tmp = _mm256_add_epi16(lines[4], lines[5]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 6));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 10));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 8));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 8));
  partial6 = _mm256_add_epi16(partial6, tmp);

  /* Partial sums for lines 6 and 7. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[6], 2));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[6], 14));
  partial4a = _mm256_add_epi16(partial4a, lines[7]);
  tmp = _mm256_add_epi16(lines[6], lines[7]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 4));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 12));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 10));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 6));
  partial6 = _mm256_add_epi16(partial6, tmp);

  const __m256i const_reg_1 =
      _mm256_set_epi32(210, 280, 420, 840, 210, 280, 420, 840);
  const __m256i const_reg_2 =
      _mm256_set_epi32(105, 120, 140, 168, 105, 120, 140, 168);
  const __m256i const_reg_3 = _mm256_set_epi32(210, 420, 0, 0, 210, 420, 0, 0);
  const __m256i const_reg_4 =
      _mm256_set_epi32(105, 105, 105, 140, 105, 105, 105, 140);

  /* Compute costs in terms of partial sums. */
  partial4a =
      fold_mul_and_sum_avx2(&partial4a, &partial4b, &const_reg_1, &const_reg_2);
  partial7a =
      fold_mul_and_sum_avx2(&partial7a, &partial7b, &const_reg_3, &const_reg_4);
  partial5a =
      fold_mul_and_sum_avx2(&partial5a, &partial5b, &const_reg_3, &const_reg_4);
  partial6 = _mm256_madd_epi16(partial6, partial6);
  partial6 = _mm256_mullo_epi32(partial6, _mm256_set1_epi32(105));

  partial4a = hsum4_avx2(&partial4a, &partial5a, &partial6, &partial7a);
  _mm_storeu_si128((__m128i *)cost_frist_8x8,
                   _mm256_castsi256_si128(partial4a));
  _mm_storeu_si128((__m128i *)cost_second_8x8,
                   _mm256_extractf128_si256(partial4a, 1));

  return partial4a;
}